

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

kvtree * kvtree_set_kv(kvtree *hash,char *key,char *val)

{
  kvtree *hash_00;
  kvtree *pkVar1;
  
  if (hash == (kvtree *)0x0) {
    pkVar1 = (kvtree *)0x0;
  }
  else {
    hash_00 = kvtree_get(hash,key);
    if (hash_00 == (kvtree *)0x0) {
      pkVar1 = kvtree_new();
      hash_00 = kvtree_set(hash,key,pkVar1);
    }
    pkVar1 = kvtree_get(hash_00,val);
    if (pkVar1 == (kvtree *)0x0) {
      pkVar1 = kvtree_new();
      pkVar1 = kvtree_set(hash_00,val,pkVar1);
      return pkVar1;
    }
  }
  return pkVar1;
}

Assistant:

kvtree* kvtree_set_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree* k = kvtree_get(hash, key);
  if (k == NULL) {
    k = kvtree_set(hash, key, kvtree_new());
  }

  kvtree* v = kvtree_get(k, val);
  if (v == NULL) {
    v = kvtree_set(k, val, kvtree_new());
  }

  return v;
}